

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int mem_expr_eq(mem_expr_t e1,mem_expr_t e2,void *arg)

{
  char cVar1;
  MIR_insn_t pMVar2;
  MIR_insn_t pMVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  char cVar9;
  char cVar10;
  
  pMVar2 = e1->insn;
  if (((*(uint *)&pMVar2->field_0x18 & 0xfffffffc) != 0) ||
     (pMVar3 = e2->insn, (*(uint *)&pMVar3->field_0x18 & 0xfffffffc) != 0)) {
    __assert_fail("move_code_p (st1->code) && move_code_p (st2->code)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0xe69,"int mem_expr_eq(mem_expr_t, mem_expr_t, void *)");
  }
  lVar7 = 0x50;
  lVar8 = 0x50;
  if (pMVar2->ops[0].field_0x8 == '\v') {
    lVar8 = 0x20;
  }
  if (pMVar3->ops[0].field_0x8 == '\v') {
    lVar7 = 0x20;
  }
  if ((*(char *)((long)pMVar2->ops + lVar8 + -0x18) == '\v') &&
     (*(char *)((long)pMVar3->ops + lVar7 + -0x18) == '\v')) {
    lVar4 = *(long *)((long)pMVar2->ops + lVar8 + -0x20);
    uVar6 = 0;
    if ((lVar4 != 0) && (lVar5 = *(long *)((long)pMVar3->ops + lVar7 + -0x20), lVar5 != 0)) {
      lVar4 = *(long *)(lVar4 + 8);
      lVar5 = *(long *)(lVar5 + 8);
      if ((*(char *)(lVar4 + 8) == *(char *)(lVar5 + 8)) &&
         (*(long *)(lVar4 + 0x18) == *(long *)(lVar5 + 0x18))) {
        cVar1 = *(char *)((long)pMVar2->ops + lVar8 + -0x10);
        cVar10 = '\x06';
        if ((cVar1 != '\a') && (cVar10 = cVar1, cVar1 == '\v')) {
          cVar10 = '\x04';
        }
        cVar1 = *(char *)((long)pMVar3->ops + lVar7 + -0x10);
        cVar9 = '\x06';
        if ((cVar1 != '\a') && (cVar9 = cVar1, cVar1 == '\v')) {
          cVar9 = '\x04';
        }
        if ((cVar10 == cVar9) &&
           (*(int *)((long)pMVar2->ops + lVar8 + -0xc) == *(int *)((long)pMVar3->ops + lVar7 + -0xc)
           )) {
          uVar6 = (uint)(*(int *)((long)pMVar2->ops + lVar8 + -8) ==
                        *(int *)((long)pMVar3->ops + lVar7 + -8));
        }
      }
    }
    return uVar6;
  }
  __assert_fail("op_ref1->mode == MIR_OP_VAR_MEM && op_ref2->mode == MIR_OP_VAR_MEM",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xe6c,"int mem_expr_eq(mem_expr_t, mem_expr_t, void *)");
}

Assistant:

static int mem_expr_eq (mem_expr_t e1, mem_expr_t e2, void *arg MIR_UNUSED) {
  MIR_insn_t st1 = e1->insn, st2 = e2->insn;
  MIR_op_t *op_ref1 = &st1->ops[0], *op_ref2 = &st2->ops[0];
  ssa_edge_t ssa_edge1, ssa_edge2;

  gen_assert (move_code_p (st1->code) && move_code_p (st2->code));
  if (op_ref1->mode != MIR_OP_VAR_MEM) op_ref1 = &st1->ops[1];
  if (op_ref2->mode != MIR_OP_VAR_MEM) op_ref2 = &st2->ops[1];
  gen_assert (op_ref1->mode == MIR_OP_VAR_MEM && op_ref2->mode == MIR_OP_VAR_MEM);
  ssa_edge1 = op_ref1->data;
  ssa_edge2 = op_ref2->data;
  return (ssa_edge1 != NULL && ssa_edge2 != NULL
          && ssa_edge1->def->gvn_val_const_p == ssa_edge2->def->gvn_val_const_p
          && ssa_edge1->def->gvn_val == ssa_edge2->def->gvn_val
          && canonic_mem_type (op_ref1->u.var_mem.type)
               == canonic_mem_type (op_ref2->u.var_mem.type)
          && op_ref1->u.var_mem.alias == op_ref2->u.var_mem.alias
          && op_ref1->u.var_mem.nonalias == op_ref2->u.var_mem.nonalias);
}